

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

char * __thiscall pstack::Context::dirname(Context *this,char *__path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  allocator<char> local_29;
  size_type local_28;
  size_type it;
  string *in_local;
  Context *this_local;
  
  it = (size_type)in_RDX;
  in_local = (string *)__path;
  this_local = this;
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                       (in_RDX,'/',0xffffffffffffffff);
  if (local_28 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)this,".",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it,0,local_28);
  }
  return (char *)this;
}

Assistant:

std::string
Context::dirname(const std::string &in)
{
    auto it = in.rfind('/');
    if (it == std::string::npos)
        return ".";
    return in.substr(0, it);
}